

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pm_matrix_tests.h
# Opt level: O1

void test_maximal_dimension<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>
               (Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true>_>
                *m)

{
  R_matrix *this;
  Column_container *this_00;
  Matrix_row_access_option *__args_3;
  Index IVar1;
  undefined4 local_128;
  int local_124;
  undefined1 *local_120;
  int *local_118;
  uint local_110 [2];
  undefined8 local_108;
  shared_count sStack_100;
  Column_settings **local_f8;
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true>_>_>
  *local_f0;
  undefined **local_e8;
  undefined1 local_e0;
  undefined8 *local_d8;
  char *local_d0;
  initializer_list<unsigned_int> local_c8;
  undefined8 *local_b8;
  int **local_b0;
  initializer_list<unsigned_int> local_a0;
  undefined8 *local_90;
  undefined1 **local_88;
  char *local_80;
  char *local_78;
  undefined1 *local_70;
  undefined1 *local_68;
  char *local_60;
  char *local_58;
  undefined1 *local_50;
  undefined1 *local_48;
  char *local_40;
  char *local_38;
  
  local_40 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_38 = "";
  local_50 = &boost::unit_test::basic_cstring<char_const>::null;
  local_48 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_40,0x39f);
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_00251de8;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_124 = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
  local_118 = &local_124;
  local_128 = 2;
  local_110[0] = CONCAT31(local_110[0]._1_3_,local_124 == 2);
  local_108 = 0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  local_b0 = &local_118;
  local_c8._M_len = local_c8._M_len & 0xffffffffffffff00;
  local_c8._M_array = (iterator)&PTR__lazy_ostream_00251da8;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_a0._M_len = local_a0._M_len & 0xffffffffffffff00;
  local_88 = &local_120;
  local_a0._M_array = (iterator)&PTR__lazy_ostream_00251da8;
  local_90 = &boost::unit_test::lazy_ostream::inst;
  local_120 = (undefined1 *)&local_128;
  boost::test_tools::tt_detail::report_assertion();
  boost::detail::shared_count::~shared_count(&sStack_100);
  local_c8._M_array = (iterator)0x100000000;
  local_c8._M_len = 0x300000002;
  local_b8 = (undefined8 *)0x500000004;
  local_a0._M_len = 6;
  this = &(m->matrix_).reducedMatrixR_;
  local_110[0] = 5;
  this_00 = &(m->matrix_).reducedMatrixR_.matrix_;
  __args_3 = &(m->matrix_).reducedMatrixR_.super_Matrix_row_access_option;
  local_f8 = &(m->matrix_).reducedMatrixR_.colSettings_;
  local_f0 = &m->matrix_;
  local_a0._M_array = (iterator)&local_c8;
  local_e8._0_4_ = (m->matrix_).reducedMatrixR_.nextInsertIndex_;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>>>
  ::
  emplace_back<unsigned_int&,std::initializer_list<unsigned_int>const&,int&,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>*&,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>::Column_z2_settings*&>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>>>
              *)this_00,(uint *)&local_e8,&local_a0,(int *)local_110,&__args_3->rows_,local_f8);
  Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_up
            (&this->super_Matrix_dimension_option,local_110[0]);
  IVar1 = (m->matrix_).reducedMatrixR_.nextInsertIndex_;
  (m->matrix_).reducedMatrixR_.nextInsertIndex_ = IVar1 + 1;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true>_>_>
  ::_insert_boundary(&m->matrix_,IVar1);
  local_c8._M_array = (iterator)&local_a0;
  local_a0._M_array = (iterator)0x100000000;
  local_a0._M_len = 0x300000002;
  local_c8._M_len = 4;
  local_e8 = (undefined **)CONCAT44(local_e8._4_4_,(m->matrix_).reducedMatrixR_.nextInsertIndex_);
  local_110[0] = 3;
  std::
  vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>>>
  ::
  emplace_back<unsigned_int&,std::initializer_list<unsigned_int>const&,int&,std::map<unsigned_int,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>,std::less<unsigned_int>,std::allocator<std::pair<unsigned_int_const,boost::intrusive::list<Gudhi::persistence_matrix::Entry<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>,boost::intrusive::constant_time_size<false>,boost::intrusive::base_hook<boost::intrusive::list_base_hook<boost::intrusive::tag<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>::Matrix_row_tag>,boost::intrusive::link_mode<(boost::intrusive::link_mode_type)2>>>>>>>*&,Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>::Column_z2_settings*&>
            ((vector<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>,std::allocator<Gudhi::persistence_matrix::Intrusive_list_column<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,(Gudhi::persistence_matrix::Column_types)7,true,true,false,true,true,true>>>>>
              *)this_00,(uint *)&local_e8,&local_c8,(int *)local_110,&__args_3->rows_,local_f8);
  Gudhi::persistence_matrix::Matrix_all_dimension_holder<int>::update_up
            (&this->super_Matrix_dimension_option,local_110[0]);
  IVar1 = (m->matrix_).reducedMatrixR_.nextInsertIndex_;
  (m->matrix_).reducedMatrixR_.nextInsertIndex_ = IVar1 + 1;
  Gudhi::persistence_matrix::
  RU_matrix<Gudhi::persistence_matrix::Matrix<RU_rep_options_with_row_access<true,_(Gudhi::persistence_matrix::Column_types)7,_true,_true,_false,_true,_true,_true>_>_>
  ::_insert_boundary(local_f0,IVar1);
  local_60 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_58 = "";
  local_70 = &boost::unit_test::basic_cstring<char_const>::null;
  local_68 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_60,0x3a9);
  local_e0 = 0;
  local_e8 = &PTR__lazy_ostream_00251de8;
  local_d8 = &boost::unit_test::lazy_ostream::inst;
  local_d0 = "";
  local_124 = (m->matrix_).reducedMatrixR_.super_Matrix_dimension_option.maxDim_;
  local_110[0] = CONCAT31(local_110[0]._1_3_,local_124 == 5);
  local_128 = 5;
  local_108 = 0;
  sStack_100.pi_ = (sp_counted_base *)0x0;
  local_80 = 
  "/workspace/llm4binary/github/license_c_cmakelists/GUDHI[P]gudhi-devel/src/Persistence_matrix/test/pm_matrix_tests.h"
  ;
  local_78 = "";
  local_118 = &local_124;
  local_c8._M_len = local_c8._M_len & 0xffffffffffffff00;
  local_c8._M_array = (iterator)&PTR__lazy_ostream_00251da8;
  local_b8 = &boost::unit_test::lazy_ostream::inst;
  local_b0 = &local_118;
  local_a0._M_len = local_a0._M_len & 0xffffffffffffff00;
  local_a0._M_array = (iterator)&PTR__lazy_ostream_00251da8;
  local_90 = &boost::unit_test::lazy_ostream::inst;
  local_88 = &local_120;
  local_120 = (undefined1 *)&local_128;
  boost::test_tools::tt_detail::report_assertion
            (local_110,&local_e8,&local_80,0x3a9,1,2,2,"m.get_max_dimension()",&local_c8,"5",
             &local_a0);
  boost::detail::shared_count::~shared_count(&sStack_100);
  return;
}

Assistant:

void test_maximal_dimension(Matrix& m) {
  BOOST_CHECK_EQUAL(m.get_max_dimension(), 2);

  if constexpr (Matrix::Option_list::is_z2) {
    m.insert_boundary({0, 1, 2, 3, 4, 5});
    m.insert_boundary({0, 1, 2, 3});
  } else {
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}, {4, 1}, {5, 4}});
    m.insert_boundary({{0, 1}, {1, 4}, {2, 1}, {3, 4}});
  }

  BOOST_CHECK_EQUAL(m.get_max_dimension(), 5);

  if constexpr (Matrix::Option_list::has_vine_update &&
                (Matrix::Option_list::is_of_boundary_type ||
                 (Matrix::Option_list::has_map_column_container && Matrix::Option_list::has_column_pairings))) {
    m.remove_maximal_cell(7);
    BOOST_CHECK_EQUAL(m.get_max_dimension(), 3);
  }
}